

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nesintf.c
# Opt level: O2

UINT8 nes_r_mame(void *chip,UINT8 offset)

{
  UINT8 UVar1;
  NESAPU_INF *info;
  
  if (offset < 0x20) {
    UVar1 = nes_apu_read(*(void **)((long)chip + 8),offset);
    return UVar1;
  }
  if ((*(void **)((long)chip + 0x18) != (void *)0x0) && (*(char *)((long)chip + 0x28) == '\0')) {
    UVar1 = nes_read_fds(*(void **)((long)chip + 0x18),offset);
    return UVar1;
  }
  return '\0';
}

Assistant:

static UINT8 nes_r_mame(void* chip, UINT8 offset)
{
	NESAPU_INF* info = (NESAPU_INF*)chip;
	
	if (offset < 0x20)	// NES APU
	{
		return nes_apu_read(info->chip_apu, offset);
	}
	else	// FDS
	{
#ifdef EC_NES_NSFP_FDS
		if (info->chip_fds != NULL && ! info->fds_disable)
			return nes_read_fds(info->chip_fds, offset);
#endif
		return 0x00;
	}
}